

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O2

FileType cmHexFileConverter::DetermineFileType(char *inFileName)

{
  FileType FVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  ulong uVar4;
  FileType FVar5;
  uint uVar6;
  uint uVar7;
  allocator local_449;
  string local_448;
  char buf [1024];
  
  std::__cxx11::string::string((string *)&local_448,inFileName,&local_449);
  __stream = (FILE *)cmsys::SystemTools::Fopen(&local_448,"rb");
  std::__cxx11::string::~string((string *)&local_448);
  FVar5 = Binary;
  if (__stream != (FILE *)0x0) {
    pcVar3 = fgets(buf,0x400,__stream);
    if (pcVar3 == (char *)0x0) {
      buf[0] = '\0';
    }
    fclose(__stream);
    if (buf[0] == ':') {
      uVar7 = 0x20b;
      uVar6 = 0xb;
      FVar1 = IntelHex;
    }
    else {
      if (buf[0] != 'S') {
        return Binary;
      }
      uVar7 = 0x20e;
      uVar6 = 10;
      FVar1 = MotorolaSrec;
    }
    uVar2 = ChompStrlen(buf);
    if (uVar2 <= uVar7 && uVar6 <= uVar2) {
      uVar4 = 1;
      while ((FVar5 = FVar1, uVar2 != uVar4 &&
             (((byte)(buf[uVar4] - 0x30U) < 10 ||
              ((uVar6 = (byte)buf[uVar4] - 0x41, FVar5 = Binary, uVar6 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) != 0))))))) {
        uVar4 = uVar4 + 1;
      }
    }
  }
  return FVar5;
}

Assistant:

cmHexFileConverter::FileType cmHexFileConverter::DetermineFileType(
                                                        const char* inFileName)
{
  char buf[1024];
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  if (inFile == 0)
    {
    return Binary;
    }

  if(!fgets(buf, 1024, inFile))
    {
    buf[0] = 0;
    }
  fclose(inFile);
  FileType type = Binary;
  unsigned int minLineLength = 0;
  unsigned int maxLineLength = 0;
  if (buf[0] == ':') // might be an intel hex file
    {
    type = IntelHex;
    minLineLength = INTEL_HEX_MIN_LINE_LENGTH;
    maxLineLength = INTEL_HEX_MAX_LINE_LENGTH;
    }
  else if (buf[0] == 'S') // might be a motorola srec file
    {
    type = MotorolaSrec;
    minLineLength = MOTOROLA_SREC_MIN_LINE_LENGTH;
    maxLineLength = MOTOROLA_SREC_MAX_LINE_LENGTH;
    }
  else
    {
    return Binary;
    }

  unsigned int slen = ChompStrlen(buf);
  if ((slen < minLineLength) || (slen > maxLineLength))
    {
    return Binary;
    }

  for (unsigned int i = 1; i < slen; i++)
    {
    if (!cm_IsHexChar(buf[i]))
      {
      return Binary;
      }
    }
  return type;
}